

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magics.cpp
# Opt level: O2

U64 magics::attacks<(Piece)3>(Square *s,U64 *block)

{
  Square SVar1;
  int *piVar2;
  U64 tmp;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int sqs;
  uint uVar6;
  Square SVar7;
  uint uVar8;
  long lVar9;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_01;
  allocator_type local_c3;
  allocator_type local_c2;
  allocator_type local_c1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  steps;
  int local_a8 [8];
  _Vector_base<int,_std::allocator<int>_> local_88;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  vector<int,_std::allocator<int>_> local_58;
  vector<int,_std::allocator<int>_> local_40;
  
  local_68 = 0;
  uStack_60 = 0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_70 = 0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8[4] = -7;
  local_a8[5] = 7;
  local_a8[6] = -9;
  local_a8[7] = 9;
  __l._M_len = 4;
  __l._M_array = local_a8 + 4;
  std::vector<int,_std::allocator<int>_>::vector(&local_58,__l,&local_c1);
  local_a8[0] = -1;
  local_a8[1] = 1;
  local_a8[2] = -8;
  local_a8[3] = 8;
  __l_00._M_len = 4;
  __l_00._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l_00,&local_c2);
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&local_88;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&steps,__l_01,&local_c3);
  lVar9 = 0x48;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)
               ((long)&local_88._M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  SVar1 = *s;
  uVar3 = 0;
  for (piVar2 = steps.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[3].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar2 != steps.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[3].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar2 = piVar2 + 1) {
    uVar5 = 0;
    for (uVar6 = 1; ((*block & uVar5) == 0 && (uVar6 < 8)); uVar6 = uVar6 + 1) {
      SVar7 = *piVar2 * uVar6 + SVar1;
      if (SVar7 < squares) {
        uVar8 = ((int)SVar1 >> 3) - (SVar7 >> 3);
        uVar4 = -uVar8;
        if (0 < (int)uVar8) {
          uVar4 = uVar8;
        }
        if ((uVar4 < 8) && (((SVar7 ^ SVar1) < A2 || (((SVar7 ^ SVar1) & H1) == A1)))) {
          uVar5 = uVar5 | 1L << ((ulong)SVar7 & 0x3f);
        }
      }
    }
    uVar3 = uVar3 | uVar5;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&steps);
  return uVar3;
}

Assistant:

U64 magics::attacks(const Square& s, const U64& block) {
	std::vector< std::vector<int> > steps =
	{ {}, // pawn
		{}, // knight
		{-7, 7, -9, 9}, // bishop
		{-1, 1, -8, 8}  // rook
	};
	U64 bm = 0ULL;
	for (auto& step : steps[p]) {
		U64 tmp = 0ULL;
		int sqs = 1;

		while ((tmp & block) == 0ULL && sqs < 8) {
			int to = s + (sqs++) * step;
			if (util::on_board(to) &&
				util::col_dist(s, to) <= 7 &&
				util::row_dist(s, to) <= 7 &&
				((p == Piece::bishop && util::on_diagonal(s, to)) ||
					(p == Piece::rook && (util::same_row(s, to) || util::same_col(s, to))))) {
				tmp |= (1ULL << to);
			}
		}
		bm |= tmp;
	}
	return bm;
}